

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O0

bool __thiscall Mapper::mapOpcode(Mapper *this,string *opcodeName,AssemberInstruction *instruction)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  out_of_range anon_var_0;
  uchar local_30;
  uint uStack_2c;
  pair<unsigned_char,_unsigned_int> opcode;
  AssemberInstruction *instruction_local;
  string *opcodeName_local;
  Mapper *this_local;
  
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_char,_unsigned_int>_>_>_>
           ::operator[](&this->opcodeMap,opcodeName);
  mVar1 = *pmVar2;
  local_30 = mVar1.first;
  instruction->opcode = local_30;
  uStack_2c = mVar1.second;
  instruction->operands = uStack_2c;
  return true;
}

Assistant:

bool Mapper::mapOpcode(std::string opcodeName, AssemberInstruction&instruction) {
	try {
		std::pair<unsigned char, unsigned int> opcode = opcodeMap[opcodeName];
		instruction.opcode = opcode.first;
		instruction.operands = opcode.second;
		return true;
	}
	catch (std::out_of_range) {
		return false;
	}
}